

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O0

unsigned_long PaUtil_EndBufferProcessing(PaUtilBufferProcessor *bp,int *streamCallbackResult)

{
  unsigned_long uVar1;
  unsigned_long local_80;
  unsigned_long local_78;
  void *local_70;
  unsigned_long framesProcessedThisIteration;
  PaUtilChannelDescriptor *hostOutputChannels;
  unsigned_long *hostOutputFrameCount;
  unsigned_long noOutputOutputFrameCount;
  PaUtilChannelDescriptor *hostInputChannels;
  unsigned_long *hostInputFrameCount;
  unsigned_long noInputInputFrameCount;
  unsigned_long framesProcessed;
  unsigned_long framesToGo;
  unsigned_long framesToProcess;
  int *streamCallbackResult_local;
  PaUtilBufferProcessor *bp_local;
  
  noInputInputFrameCount = 0;
  framesToProcess = (unsigned_long)streamCallbackResult;
  streamCallbackResult_local = (int *)bp;
  if ((((bp->inputChannelCount != 0) && (bp->outputChannelCount != 0)) &&
      (bp->hostInputChannels[0]->data != (void *)0x0)) &&
     ((bp->hostOutputChannels[0]->data != (void *)0x0 &&
      (bp->hostInputFrameCount[0] + bp->hostInputFrameCount[1] !=
       bp->hostOutputFrameCount[0] + bp->hostOutputFrameCount[1])))) {
    __assert_fail("(bp->hostInputFrameCount[0] + bp->hostInputFrameCount[1]) == (bp->hostOutputFrameCount[0] + bp->hostOutputFrameCount[1])"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/common/pa_process.c"
                  ,0x5d6,"unsigned long PaUtil_EndBufferProcessing(PaUtilBufferProcessor *, int *)")
    ;
  }
  if (((*streamCallbackResult != 0) && (*streamCallbackResult != 1)) && (*streamCallbackResult != 2)
     ) {
    __assert_fail("*streamCallbackResult == paContinue || *streamCallbackResult == paComplete || *streamCallbackResult == paAbort"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/common/pa_process.c"
                  ,0x5db,"unsigned long PaUtil_EndBufferProcessing(PaUtilBufferProcessor *, int *)")
    ;
  }
  if (bp->useNonAdaptingProcess == 0) {
    if ((bp->inputChannelCount == 0) || (bp->outputChannelCount == 0)) {
      if (bp->inputChannelCount == 0) {
        framesToGo = bp->hostOutputFrameCount[0];
        noInputInputFrameCount =
             AdaptingOutputOnlyProcess(bp,streamCallbackResult,bp->hostOutputChannels[0],framesToGo)
        ;
        framesToGo = *(unsigned_long *)(streamCallbackResult_local + 0x3c);
        if (framesToGo != 0) {
          uVar1 = AdaptingOutputOnlyProcess
                            ((PaUtilBufferProcessor *)streamCallbackResult_local,
                             (int *)framesToProcess,
                             *(PaUtilChannelDescriptor **)(streamCallbackResult_local + 0x40),
                             framesToGo);
          noInputInputFrameCount = uVar1 + noInputInputFrameCount;
        }
      }
      else {
        framesToGo = bp->hostInputFrameCount[0];
        noInputInputFrameCount =
             AdaptingInputOnlyProcess(bp,streamCallbackResult,bp->hostInputChannels[0],framesToGo);
        framesToGo = *(unsigned_long *)(streamCallbackResult_local + 0x32);
        if (framesToGo != 0) {
          uVar1 = AdaptingInputOnlyProcess
                            ((PaUtilBufferProcessor *)streamCallbackResult_local,
                             (int *)framesToProcess,
                             *(PaUtilChannelDescriptor **)(streamCallbackResult_local + 0x36),
                             framesToGo);
          noInputInputFrameCount = uVar1 + noInputInputFrameCount;
        }
      }
    }
    else if (bp->hostBufferSizeMode == paUtilVariableHostBufferSizePartialUsageAllowed) {
      noInputInputFrameCount = AdaptingProcess(bp,streamCallbackResult,0);
    }
    else {
      noInputInputFrameCount = AdaptingProcess(bp,streamCallbackResult,1);
    }
  }
  else if ((bp->inputChannelCount == 0) || (bp->outputChannelCount == 0)) {
    if (bp->inputChannelCount == 0) {
      local_78 = bp->hostOutputFrameCount[0];
    }
    else {
      local_78 = bp->hostInputFrameCount[0];
    }
    framesToGo = local_78;
    noInputInputFrameCount =
         NonAdaptingProcess(bp,streamCallbackResult,bp->hostInputChannels[0],
                            bp->hostOutputChannels[0],local_78);
    if (streamCallbackResult_local[10] == 0) {
      local_80 = *(unsigned_long *)(streamCallbackResult_local + 0x3c);
    }
    else {
      local_80 = *(unsigned_long *)(streamCallbackResult_local + 0x32);
    }
    framesToGo = local_80;
    if (local_80 != 0) {
      uVar1 = NonAdaptingProcess((PaUtilBufferProcessor *)streamCallbackResult_local,
                                 (int *)framesToProcess,
                                 *(PaUtilChannelDescriptor **)(streamCallbackResult_local + 0x36),
                                 *(PaUtilChannelDescriptor **)(streamCallbackResult_local + 0x40),
                                 local_80);
      noInputInputFrameCount = uVar1 + noInputInputFrameCount;
    }
  }
  else {
    framesProcessed = bp->hostOutputFrameCount[0] + bp->hostOutputFrameCount[1];
    do {
      if (**(long **)(streamCallbackResult_local + 0x34) == 0) {
        hostInputFrameCount = (unsigned_long *)framesProcessed;
        hostInputChannels = (PaUtilChannelDescriptor *)&hostInputFrameCount;
        noOutputOutputFrameCount = 0;
      }
      else if (*(long *)(streamCallbackResult_local + 0x30) == 0) {
        hostInputChannels = (PaUtilChannelDescriptor *)(streamCallbackResult_local + 0x32);
        noOutputOutputFrameCount = *(unsigned_long *)(streamCallbackResult_local + 0x36);
      }
      else {
        hostInputChannels = (PaUtilChannelDescriptor *)(streamCallbackResult_local + 0x30);
        noOutputOutputFrameCount = *(unsigned_long *)(streamCallbackResult_local + 0x34);
      }
      if (*(long *)(streamCallbackResult_local + 0x3a) == 0) {
        hostOutputChannels = (PaUtilChannelDescriptor *)(streamCallbackResult_local + 0x3c);
        framesProcessedThisIteration = *(unsigned_long *)(streamCallbackResult_local + 0x40);
      }
      else {
        hostOutputChannels = (PaUtilChannelDescriptor *)(streamCallbackResult_local + 0x3a);
        framesProcessedThisIteration = *(unsigned_long *)(streamCallbackResult_local + 0x3e);
      }
      if (hostInputChannels->data < hostOutputChannels->data) {
        local_70 = hostInputChannels->data;
      }
      else {
        local_70 = hostOutputChannels->data;
      }
      framesToGo = (unsigned_long)local_70;
      if (local_70 == (void *)0x0) {
        __assert_fail("framesToProcess != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/common/pa_process.c"
                      ,0x61a,
                      "unsigned long PaUtil_EndBufferProcessing(PaUtilBufferProcessor *, int *)");
      }
      uVar1 = NonAdaptingProcess((PaUtilBufferProcessor *)streamCallbackResult_local,
                                 (int *)framesToProcess,
                                 (PaUtilChannelDescriptor *)noOutputOutputFrameCount,
                                 (PaUtilChannelDescriptor *)framesProcessedThisIteration,
                                 (unsigned_long)local_70);
      hostInputChannels->data = (void *)((long)hostInputChannels->data - uVar1);
      hostOutputChannels->data = (void *)((long)hostOutputChannels->data - uVar1);
      noInputInputFrameCount = uVar1 + noInputInputFrameCount;
      framesProcessed = framesProcessed - uVar1;
    } while (framesProcessed != 0);
  }
  return noInputInputFrameCount;
}

Assistant:

unsigned long PaUtil_EndBufferProcessing( PaUtilBufferProcessor* bp, int *streamCallbackResult )
{
    unsigned long framesToProcess, framesToGo;
    unsigned long framesProcessed = 0;
    
    if( bp->inputChannelCount != 0 && bp->outputChannelCount != 0
            && bp->hostInputChannels[0][0].data /* input was supplied (see PaUtil_SetNoInput) */
            && bp->hostOutputChannels[0][0].data /* output was supplied (see PaUtil_SetNoOutput) */ )
    {
        assert( (bp->hostInputFrameCount[0] + bp->hostInputFrameCount[1]) ==
                (bp->hostOutputFrameCount[0] + bp->hostOutputFrameCount[1]) );
    }

    assert( *streamCallbackResult == paContinue
            || *streamCallbackResult == paComplete
            || *streamCallbackResult == paAbort ); /* don't forget to pass in a valid callback result value */

    if( bp->useNonAdaptingProcess )
    {
        if( bp->inputChannelCount != 0 && bp->outputChannelCount != 0 )
        {
            /* full duplex non-adapting process, splice buffers if they are
                different lengths */

            framesToGo = bp->hostOutputFrameCount[0] + bp->hostOutputFrameCount[1]; /* relies on assert above for input/output equivalence */

            do{
                unsigned long noInputInputFrameCount;
                unsigned long *hostInputFrameCount;
                PaUtilChannelDescriptor *hostInputChannels;
                unsigned long noOutputOutputFrameCount;
                unsigned long *hostOutputFrameCount;
                PaUtilChannelDescriptor *hostOutputChannels;
                unsigned long framesProcessedThisIteration;

                if( !bp->hostInputChannels[0][0].data )
                {
                    /* no input was supplied (see PaUtil_SetNoInput)
                        NonAdaptingProcess knows how to deal with this
                    */
                    noInputInputFrameCount = framesToGo;
                    hostInputFrameCount = &noInputInputFrameCount;
                    hostInputChannels = 0;
                }
                else if( bp->hostInputFrameCount[0] != 0 )
                {
                    hostInputFrameCount = &bp->hostInputFrameCount[0];
                    hostInputChannels = bp->hostInputChannels[0];
                }
                else
                {
                    hostInputFrameCount = &bp->hostInputFrameCount[1];
                    hostInputChannels = bp->hostInputChannels[1];
                }

                if( !bp->hostOutputChannels[0][0].data )
                {
                    /* no output was supplied (see PaUtil_SetNoOutput)
                        NonAdaptingProcess knows how to deal with this
                    */
                    noOutputOutputFrameCount = framesToGo;
                    hostOutputFrameCount = &noOutputOutputFrameCount;
                    hostOutputChannels = 0;
                }
                if( bp->hostOutputFrameCount[0] != 0 )
                {
                    hostOutputFrameCount = &bp->hostOutputFrameCount[0];
                    hostOutputChannels = bp->hostOutputChannels[0];
                }
                else
                {
                    hostOutputFrameCount = &bp->hostOutputFrameCount[1];
                    hostOutputChannels = bp->hostOutputChannels[1];
                }

                framesToProcess = PA_MIN_( *hostInputFrameCount,
                                       *hostOutputFrameCount );

                assert( framesToProcess != 0 );
                
                framesProcessedThisIteration = NonAdaptingProcess( bp, streamCallbackResult,
                        hostInputChannels, hostOutputChannels,
                        framesToProcess );                                       

                *hostInputFrameCount -= framesProcessedThisIteration;
                *hostOutputFrameCount -= framesProcessedThisIteration;

                framesProcessed += framesProcessedThisIteration;
                framesToGo -= framesProcessedThisIteration;
                
            }while( framesToGo > 0 );
        }
        else
        {
            /* half duplex non-adapting process, just process 1st and 2nd buffer */
            /* process first buffer */

            framesToProcess = (bp->inputChannelCount != 0)
                            ? bp->hostInputFrameCount[0]
                            : bp->hostOutputFrameCount[0];

            framesProcessed = NonAdaptingProcess( bp, streamCallbackResult,
                        bp->hostInputChannels[0], bp->hostOutputChannels[0],
                        framesToProcess );

            /* process second buffer if provided */
    
            framesToProcess = (bp->inputChannelCount != 0)
                            ? bp->hostInputFrameCount[1]
                            : bp->hostOutputFrameCount[1];
            if( framesToProcess > 0 )
            {
                framesProcessed += NonAdaptingProcess( bp, streamCallbackResult,
                    bp->hostInputChannels[1], bp->hostOutputChannels[1],
                    framesToProcess );
            }
        }
    }
    else /* block adaption necessary*/
    {

        if( bp->inputChannelCount != 0 && bp->outputChannelCount != 0 )
        {
            /* full duplex */
            
            if( bp->hostBufferSizeMode == paUtilVariableHostBufferSizePartialUsageAllowed  )
            {
                framesProcessed = AdaptingProcess( bp, streamCallbackResult,
                        0 /* dont process partial user buffers */ );
            }
            else
            {
                framesProcessed = AdaptingProcess( bp, streamCallbackResult,
                        1 /* process partial user buffers */ );
            }
        }
        else if( bp->inputChannelCount != 0 )
        {
            /* input only */
            framesToProcess = bp->hostInputFrameCount[0];

            framesProcessed = AdaptingInputOnlyProcess( bp, streamCallbackResult,
                        bp->hostInputChannels[0], framesToProcess );

            framesToProcess = bp->hostInputFrameCount[1];
            if( framesToProcess > 0 )
            {
                framesProcessed += AdaptingInputOnlyProcess( bp, streamCallbackResult,
                        bp->hostInputChannels[1], framesToProcess );
            }
        }
        else
        {
            /* output only */
            framesToProcess = bp->hostOutputFrameCount[0];

            framesProcessed = AdaptingOutputOnlyProcess( bp, streamCallbackResult,
                        bp->hostOutputChannels[0], framesToProcess );

            framesToProcess = bp->hostOutputFrameCount[1];
            if( framesToProcess > 0 )
            {
                framesProcessed += AdaptingOutputOnlyProcess( bp, streamCallbackResult,
                        bp->hostOutputChannels[1], framesToProcess );
            }
        }
    }

    return framesProcessed;
}